

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMovemEaRg<(moira::Instr)78,(moira::Mode)2,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char cVar6;
  Ea<(moira::Mode)2,_2> src;
  u32 local_34;
  ushort local_30;
  
  *addr = *addr + 2;
  iVar3 = (*this->_vptr_Moira[6])();
  local_30 = op & 7;
  local_34 = *addr;
  cVar6 = 'm';
  lVar4 = 1;
  do {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = cVar6;
    cVar6 = "fmovem"[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  pcVar5 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar5 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar5 = '.';
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
  }
  *pcVar5 = 'w';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar5 = str->ptr;
    do {
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    } while (pcVar5 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)2,_2> *)&local_34);
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,(RegRegList)(u16)iVar3);
  return;
}

Assistant:

void
Moira::dasmMovemEaRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = RegRegList ( (u16)dasmIncRead<Word>(addr)  );
    auto src = Op <M,S>   ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}